

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_gettable(lua_State *L,int idx)

{
  TValue *pTVar1;
  cTValue *pcVar2;
  
  pTVar1 = index2adr(L,idx);
  pcVar2 = lj_meta_tget(L,pTVar1,L->top + -1);
  if (pcVar2 == (cTValue *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + 2;
    lj_vm_call(L,pTVar1,2);
    pTVar1 = L->top;
    L->top = pTVar1 + -3;
    pcVar2 = pTVar1 + -1;
  }
  L->top[-1] = *pcVar2;
  return;
}

Assistant:

LUA_API void lua_gettable(lua_State *L, int idx)
{
  cTValue *t = index2adr_check(L, idx);
  cTValue *v = lj_meta_tget(L, t, L->top-1);
  if (v == NULL) {
    L->top += 2;
    lj_vm_call(L, L->top-2, 1+1);
    L->top -= 2+LJ_FR2;
    v = L->top+1+LJ_FR2;
  }
  copyTV(L, L->top-1, v);
}